

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

bool EDCircles::CircleFit(double *x,double *y,int N,double *pxc,double *pyc,double *pr,double *pe)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double d;
  double dy;
  double dx;
  double dStack_e0;
  int i_2;
  double error;
  double R;
  double vc;
  double uc;
  double b2;
  double b1;
  double detA;
  double v;
  double u;
  double dStack_90;
  int i_1;
  double Svuu;
  double Svvv;
  double Suvv;
  double Suuu;
  double Svv;
  double Suv;
  double Suu;
  double dStack_50;
  int i;
  double yAvg;
  double xAvg;
  double *pr_local;
  double *pyc_local;
  double *pxc_local;
  int N_local;
  double *y_local;
  double *x_local;
  
  *pe = 1e+20;
  if (N < 3) {
    x_local._7_1_ = false;
  }
  else {
    yAvg = 0.0;
    dStack_50 = 0.0;
    for (Suu._4_4_ = 0; Suu._4_4_ < N; Suu._4_4_ = Suu._4_4_ + 1) {
      yAvg = x[Suu._4_4_] + yAvg;
      dStack_50 = y[Suu._4_4_] + dStack_50;
    }
    Suv = 0.0;
    Svv = 0.0;
    Suuu = 0.0;
    Suvv = 0.0;
    Svvv = 0.0;
    Svuu = 0.0;
    dStack_90 = 0.0;
    for (u._4_4_ = 0; u._4_4_ < N; u._4_4_ = u._4_4_ + 1) {
      dVar1 = x[u._4_4_] - yAvg / (double)N;
      dVar2 = y[u._4_4_] - dStack_50 / (double)N;
      Suv = dVar1 * dVar1 + Suv;
      Svv = dVar1 * dVar2 + Svv;
      Suuu = dVar2 * dVar2 + Suuu;
      Suvv = dVar1 * dVar1 * dVar1 + Suvv;
      Svvv = dVar1 * dVar2 * dVar2 + Svvv;
      Svuu = dVar2 * dVar2 * dVar2 + Svuu;
      dStack_90 = dVar2 * dVar1 * dVar1 + dStack_90;
    }
    dVar1 = Suv * Suuu + -(Svv * Svv);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      dVar2 = (Suvv + Svvv) * 0.5;
      dVar3 = (Svuu + dStack_90) * 0.5;
      dVar4 = (Suuu * dVar2 + -(Svv * dVar3)) / dVar1;
      dVar1 = (Suv * dVar3 + -(Svv * dVar2)) / dVar1;
      dVar2 = sqrt(dVar4 * dVar4 + dVar1 * dVar1 + (Suv + Suuu) / (double)N);
      *pxc = dVar4 + yAvg / (double)N;
      *pyc = dVar1 + dStack_50 / (double)N;
      dStack_e0 = 0.0;
      for (dx._4_4_ = 0; dx._4_4_ < N; dx._4_4_ = dx._4_4_ + 1) {
        dVar1 = sqrt((x[dx._4_4_] - *pxc) * (x[dx._4_4_] - *pxc) +
                     (y[dx._4_4_] - *pyc) * (y[dx._4_4_] - *pyc));
        dStack_e0 = (dVar1 - dVar2) * (dVar1 - dVar2) + dStack_e0;
      }
      *pr = dVar2;
      dVar1 = sqrt(dStack_e0 / (double)N);
      *pe = dVar1;
      x_local._7_1_ = true;
    }
    else {
      x_local._7_1_ = false;
    }
  }
  return x_local._7_1_;
}

Assistant:

bool EDCircles::CircleFit(double * x, double * y, int N, double * pxc, double * pyc, double * pr, double * pe)
{
	*pe = 1e20;
	if (N < 3) return false;

	double xAvg = 0;
	double yAvg = 0;

	for (int i = 0; i<N; i++) {
		xAvg += x[i];
		yAvg += y[i];
	} //end-for

	xAvg /= N;
	yAvg /= N;

	double Suu = 0;
	double Suv = 0;
	double Svv = 0;
	double Suuu = 0;
	double Suvv = 0;
	double Svvv = 0;
	double Svuu = 0;
	for (int i = 0; i<N; i++) {
		double u = x[i] - xAvg;
		double v = y[i] - yAvg;

		Suu += u*u;
		Suv += u*v;
		Svv += v*v;
		Suuu += u*u*u;
		Suvv += u*v*v;
		Svvv += v*v*v;
		Svuu += v*u*u;
	} //end-for

	  // Now, we solve for the following linear system of equations
	  // Av = b, where v = (uc, vc) is the center of the circle
	  //
	  // |N    Suv| |uc| = |b1|
	  // |Suv  Svv| |vc| = |b2|
	  //
	  // where b1 = 0.5*(Suuu+Suvv) and b2 = 0.5*(Svvv+Svuu)
	  //
	double detA = Suu*Svv - Suv*Suv;
	if (detA == 0) return false;

	double b1 = 0.5*(Suuu + Suvv);
	double b2 = 0.5*(Svvv + Svuu);

	double uc = (Svv*b1 - Suv*b2) / detA;
	double vc = (Suu*b2 - Suv*b1) / detA;

	double R = sqrt(uc*uc + vc*vc + (Suu + Svv) / N);

	*pxc = uc + xAvg;
	*pyc = vc + yAvg;

	// Compute mean square error
	double error = 0;
	for (int i = 0; i<N; i++) {
		double dx = x[i] - *pxc;
		double dy = y[i] - *pyc;
		double d = sqrt(dx*dx + dy*dy) - R;
		error += d*d;
	} //end-for

	*pr = R;
	*pe = sqrt(error / N);

	return true;
}